

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O1

void __thiscall
CryptoUtil_DecryptAes256Cbc_Test::~CryptoUtil_DecryptAes256Cbc_Test
          (CryptoUtil_DecryptAes256Cbc_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256Cbc) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData iv("33343536373839303132333435363738");
  ByteData data(
      "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");

  ByteData result = CryptoUtil::DecryptAes256Cbc(key, iv, data);
  EXPECT_STREQ(result.GetHex().c_str(), "74657374207465737420746573742074657374");
}